

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O2

bool absl::str_format_internal::anon_unknown_0::FallbackToSnprintf<double>
               (double v,FormatConversionSpecImpl *conv,FormatSinkImpl *sink)

{
  size_type sVar1;
  char cVar2;
  uint uVar3;
  FormatConversionSpecImpl *in_RDX;
  uint uVar4;
  ulong uVar5;
  string_view v_00;
  string space;
  char fmt [32];
  
  uVar4 = 0;
  if (0 < conv->width_) {
    uVar4 = conv->width_;
  }
  uVar5 = 0xffffffff;
  if (-1 < conv->precision_) {
    uVar5 = (ulong)(uint)conv->precision_;
  }
  fmt[0] = '%';
  FormatConversionSpecImplFriend::FlagsToString_abi_cxx11_
            (&space,(FormatConversionSpecImplFriend *)conv,in_RDX);
  sVar1 = space._M_string_length;
  memcpy(fmt + 1,space._M_dataplus._M_p,space._M_string_length);
  std::__cxx11::string::_M_dispose();
  (fmt + sVar1 + 1)[0] = '*';
  (fmt + sVar1 + 1)[1] = '.';
  fmt[sVar1 + 3] = '*';
  cVar2 = FormatConversionCharToChar(conv->conv_);
  fmt[sVar1 + 4] = cVar2;
  fmt[sVar1 + 5] = '\0';
  if (0x1a < (long)sVar1) {
    __assert_fail("fp < fmt + sizeof(fmt)",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O2/_deps/absl-src/absl/strings/internal/str_format/float_conversion.cc"
                  ,0x3d1,
                  "bool absl::str_format_internal::(anonymous namespace)::FallbackToSnprintf(const Float, const FormatConversionSpecImpl &, FormatSinkImpl *) [Float = double]"
                 );
  }
  space._M_dataplus._M_p = (pointer)&space.field_2;
  std::__cxx11::string::_M_construct((ulong)&space,'\0');
  do {
    uVar3 = snprintf(space._M_dataplus._M_p,space._M_string_length,fmt,v,(ulong)uVar4,uVar5);
    if ((int)uVar3 < 0) {
LAB_0014e2f8:
      std::__cxx11::string::_M_dispose();
      return -1 < (int)uVar3;
    }
    v_00._M_len = (ulong)uVar3;
    if (v_00._M_len < space._M_string_length) {
      v_00._M_str = space._M_dataplus._M_p;
      FormatSinkImpl::Append(sink,v_00);
      goto LAB_0014e2f8;
    }
    std::__cxx11::string::resize((ulong)&space);
  } while( true );
}

Assistant:

bool FallbackToSnprintf(const Float v, const FormatConversionSpecImpl &conv,
                        FormatSinkImpl *sink) {
  int w = conv.width() >= 0 ? conv.width() : 0;
  int p = conv.precision() >= 0 ? conv.precision() : -1;
  char fmt[32];
  {
    char *fp = fmt;
    *fp++ = '%';
    fp = CopyStringTo(FormatConversionSpecImplFriend::FlagsToString(conv), fp);
    fp = CopyStringTo("*.*", fp);
    if (std::is_same<long double, Float>()) {
      *fp++ = 'L';
    }
    *fp++ = FormatConversionCharToChar(conv.conversion_char());
    *fp = 0;
    assert(fp < fmt + sizeof(fmt));
  }
  std::string space(512, '\0');
  absl::string_view result;
  while (true) {
    int n = snprintf(&space[0], space.size(), fmt, w, p, v);
    if (n < 0) return false;
    if (static_cast<size_t>(n) < space.size()) {
      result = absl::string_view(space.data(), static_cast<size_t>(n));
      break;
    }
    space.resize(static_cast<size_t>(n) + 1);
  }
  sink->Append(result);
  return true;
}